

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall slang::ast::Scope::checkImportConflict(Scope *this,Symbol *member,Symbol *existing)

{
  Symbol *pSVar1;
  Symbol *pSVar2;
  Diagnostic *this_00;
  
  pSVar1 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)member);
  pSVar2 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)existing);
  if (pSVar2 != (Symbol *)0x0 && pSVar1 != (Symbol *)0x0) {
    if (pSVar1 != pSVar2) {
      reportNameConflict(this,member,existing);
      return;
    }
    if ((*(char *)&member[1].parentScope == '\0') && (*(char *)&existing[1].parentScope == '\0')) {
      this_00 = addDiag(this,(DiagCode)0x41000a,member->location);
      Diagnostic::addNote(this_00,(DiagCode)0xa0001,existing->location);
      return;
    }
  }
  return;
}

Assistant:

void Scope::checkImportConflict(const Symbol& member, const Symbol& existing) const {
    auto& mei = member.as<ExplicitImportSymbol>();
    auto& eei = existing.as<ExplicitImportSymbol>();

    auto s1 = mei.importedSymbol();
    auto s2 = eei.importedSymbol();
    if (!s1 || !s2)
        return;

    if (s1 == s2) {
        if (!mei.isFromExport && !eei.isFromExport) {
            // Duplicate explicit imports are specifically allowed,
            // so just ignore the other one (with a warning).
            auto& diag = addDiag(diag::DuplicateImport, member.location);
            diag.addNote(diag::NotePreviousDefinition, existing.location);
        }
    }
    else {
        reportNameConflict(member, existing);
    }
}